

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QHybrid.cpp
# Opt level: O1

void __thiscall
QHybrid::QHybrid(QHybrid *this,PlanningUnitDecPOMDPDiscrete *pu,Qheur_t QheurTypeFirstTimeSteps,
                QFunctionJointBeliefInterface *QlastTimeSteps,size_t horizonLastTimeSteps)

{
  undefined8 *puVar1;
  
  *(PlanningUnitDecPOMDPDiscrete **)&this->field_0x70 = pu;
  *(undefined8 *)&this->field_0x78 = 0;
  *(undefined8 *)&this->field_0x80 = 0;
  this->super_QFunctionJAOHInterface = (QFunctionJAOHInterface)0x5a0a68;
  *(undefined8 *)&this->field_0x68 = 0x5a0b58;
  (this->_m_QValuesFirstTimeSteps).super_matrix_t.data_.size_ = 0;
  (this->_m_QValuesFirstTimeSteps).super_matrix_t.data_.data_ = (pointer)0x0;
  (this->_m_QValuesFirstTimeSteps).super_matrix_t.size1_ = 0;
  (this->_m_QValuesFirstTimeSteps).super_matrix_t.size2_ = 0;
  (this->_m_QValuesFirstTimeSteps).super_QTableInterface._vptr_QTableInterface =
       (_func_int **)&PTR_Get_005cdfc0;
  this->_m_QheurTypeFirstTS = QheurTypeFirstTimeSteps;
  this->_m_QlastTimeSteps = QlastTimeSteps;
  this->_m_horizonLastTimeSteps = horizonLastTimeSteps;
  if (pu == (PlanningUnitDecPOMDPDiscrete *)0x0) {
    pu = *(PlanningUnitDecPOMDPDiscrete **)&this->field_0x78;
  }
  this->_m_horizonFirstTimeSteps =
       (pu->super_PlanningUnitMADPDiscrete).super_PlanningUnit._m_horizon - horizonLastTimeSteps;
  this->_m_optimizedHorLast = false;
  this->_m_initialized = false;
  if (horizonLastTimeSteps < (pu->super_PlanningUnitMADPDiscrete).super_PlanningUnit._m_horizon) {
    return;
  }
  puVar1 = (undefined8 *)__cxa_allocate_exception(0x28);
  *puVar1 = &PTR__E_0059bd80;
  puVar1[1] = puVar1 + 3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(puVar1 + 1),
             "QHybrid horizonLastTimeSteps should be at least 1 less than the problem horizon","");
  __cxa_throw(puVar1,&E::typeinfo,E::~E);
}

Assistant:

QHybrid::QHybrid(const PlanningUnitDecPOMDPDiscrete* pu,
                 Qheur_t QheurTypeFirstTimeSteps,
                 QFunctionJointBeliefInterface *QlastTimeSteps,
                 size_t horizonLastTimeSteps) : 
    QFunctionForDecPOMDP(pu), //virtual base first
    _m_QheurTypeFirstTS(QheurTypeFirstTimeSteps),
    _m_QlastTimeSteps(QlastTimeSteps),
    _m_horizonLastTimeSteps(horizonLastTimeSteps),
    _m_horizonFirstTimeSteps(GetPU()->GetHorizon()-horizonLastTimeSteps),
    _m_optimizedHorLast(false),
    _m_initialized(false)
{
    if(horizonLastTimeSteps>=GetPU()->GetHorizon())
        throw(E("QHybrid horizonLastTimeSteps should be at least 1 less than the problem horizon"));
}